

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O2

string * GetAddressAndPortAsString_abi_cxx11_(string *__return_storage_ptr__,Address address)

{
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  GetAddressAsString_abi_cxx11_(&local_38,address);
  std::operator+(&local_58,&local_38,":");
  std::__cxx11::to_string(&sStack_78,(uint)(ushort)(address.sin_port << 8 | address.sin_port >> 8));
  std::operator+(__return_storage_ptr__,&local_58,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string GetAddressAndPortAsString(Address address){
    std::string s = GetAddressAsString(address) + ":" + std::to_string(GetPort(address));
    return s;
}